

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharContent.cpp
# Opt level: O1

vector<CharContent,_std::allocator<CharContent>_> * __thiscall
CharContent::split(vector<CharContent,_std::allocator<CharContent>_> *__return_storage_ptr__,
                  CharContent *this,CharContent *s)

{
  size_t sVar1;
  ulong pos;
  CharContent local_58;
  
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pos = 0;
  sVar1 = find(this,s->m,s->size,0);
  if (sVar1 != this->npos) {
    pos = 0;
    do {
      if (pos <= sVar1 && sVar1 - pos != 0) {
        subCharContent(&local_58,this,pos,sVar1 - pos);
        std::vector<CharContent,_std::allocator<CharContent>_>::emplace_back<CharContent>
                  (__return_storage_ptr__,&local_58);
        local_58._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        if (local_58.m != (char *)0x0) {
          operator_delete__(local_58.m);
        }
      }
      pos = sVar1 + s->size;
      sVar1 = find(this,s->m,s->size,pos);
    } while (sVar1 != this->npos);
  }
  sVar1 = this->size - pos;
  if (pos <= this->size && sVar1 != 0) {
    subCharContent(&local_58,this,pos,sVar1);
    std::vector<CharContent,_std::allocator<CharContent>_>::emplace_back<CharContent>
              (__return_storage_ptr__,&local_58);
    local_58._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    if (local_58.m != (char *)0x0) {
      operator_delete__(local_58.m);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CharContent> CharContent::split(const CharContent &s){
	std::vector<CharContent> ans;
	size_t start=0,pos=0;
	while((pos=this->find(s,start))!=this->npos){
		if(pos>start)
			ans.push_back(this->subCharContent(start,pos-start));
		start=pos+s.length();
	}
	if(start<this->size)
		ans.push_back(this->subCharContent(start,this->size-start));
	return ans;
}